

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O0

char * uo_json_decode_utf8(char *dst,char *src,size_t src_len)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint32_t local_38;
  char local_31;
  int codepoint;
  uchar c;
  char *json_end;
  size_t src_len_local;
  char *src_local;
  char *dst_local;
  
  _codepoint = src + (src_len - 1);
  if (((src_len < 2) || (*src != '\"')) ||
     (json_end = (char *)src_len, src_len_local = (size_t)(src + 1), src_local = dst,
     *_codepoint != '\"')) {
    dst_local = (char *)0x0;
  }
  else {
    while (src_len_local < _codepoint) {
      pcVar2 = (char *)(src_len_local + 1);
      local_31 = *(char *)src_len_local;
      if (local_31 == '\\') {
        if (_codepoint <= pcVar2) {
          return (char *)0x0;
        }
        sVar3 = src_len_local + 2;
        switch(*pcVar2) {
        case '\"':
          *src_local = '\"';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        default:
          return (char *)0x0;
        case '/':
          *src_local = '/';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case '\\':
          *src_local = '\\';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 'b':
          *src_local = '\b';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 'f':
          *src_local = '\f';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 'n':
          *src_local = '\n';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 'r':
          *src_local = '\r';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 't':
          *src_local = '\t';
          src_len_local = sVar3;
          src_local = src_local + 1;
          break;
        case 'u':
          if (_codepoint < (char *)(src_len_local + 6)) {
            return (char *)0x0;
          }
          src_len_local = sVar3;
          iVar1 = __isoc99_sscanf(sVar3,"%04x",&local_38);
          if (iVar1 != 1) {
            return (char *)0x0;
          }
          src_len_local = src_len_local + 4;
          src_local = uo_utf8_append(src_local,local_38);
        }
      }
      else {
        *src_local = local_31;
        src_len_local = (size_t)pcVar2;
        src_local = src_local + 1;
      }
    }
    dst_local = src_local;
  }
  return dst_local;
}

Assistant:

char *uo_json_decode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    const char *json_end = src + src_len - 1;
    unsigned char c;

    if (src_len < 2 || *src++ != '\"' || *json_end != '\"')
        return NULL;

    while (src < json_end)
    {
        if ((c = *src++) == '\\')
        {
            if (src >= json_end)
                return NULL;

            switch (*src++)
            {
                case '"':  *dst++ = '"';  break;
                case '\\': *dst++ = '\\'; break;
                case '/':  *dst++ = '/';  break;
                case 'b':  *dst++ = '\b'; break;
                case 'f':  *dst++ = '\f'; break;
                case 'n':  *dst++ = '\n'; break;
                case 'r':  *dst++ = '\r'; break;
                case 't':  *dst++ = '\t'; break;
                
                case 'u':
                {
                    if (src + 4 > json_end)
                        return NULL;

                    int codepoint;
                    if (sscanf(src, "%04x", &codepoint) != 1)
                        return NULL;

                    src += 4;

                    dst = uo_utf8_append(dst, codepoint);
                    break;
                }

                default: return NULL;
            }
            continue;
        }

        *dst++ = c;
    }

    return dst;
}